

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSNamespaceItem.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSNamespaceItem::XSNamespaceItem
          (XSNamespaceItem *this,XSModel *xsModel,SchemaGrammar *grammar,MemoryManager *manager)

{
  int iVar1;
  undefined4 extraout_var;
  XSNamedMap<xercesc_4_0::XSObject> *this_00;
  RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::StringHasher> *this_01;
  RefVectorOf<xercesc_4_0::XSAnnotation> *this_02;
  ulong uVar2;
  
  this->fMemoryManager = manager;
  this->fGrammar = grammar;
  this->fXSModel = xsModel;
  this->fXSAnnotationList = (XSAnnotationList *)0x0;
  iVar1 = (*(grammar->super_Grammar).super_XSerializable._vptr_XSerializable[6])(grammar);
  this->fSchemaNamespace = (XMLCh *)CONCAT44(extraout_var,iVar1);
  for (uVar2 = 0; uVar2 != 0xe; uVar2 = uVar2 + 1) {
    if ((uVar2 < 0xb) && ((0x437UL >> (uVar2 & 0x3f) & 1) != 0)) {
      this_00 = (XSNamedMap<xercesc_4_0::XSObject> *)
                XMemory::operator_new(0x20,this->fMemoryManager);
      XSNamedMap<xercesc_4_0::XSObject>::XSNamedMap
                (this_00,0x14,0x1d,this->fXSModel->fURIStringPool,false,this->fMemoryManager);
      this->fComponentMap[uVar2] = this_00;
      this_01 = (RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::StringHasher> *)
                XMemory::operator_new(0x38,this->fMemoryManager);
      RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::StringHasher>::RefHashTableOf
                (this_01,0x1d,false,this->fMemoryManager);
    }
    else {
      this->fComponentMap[uVar2] = (XSNamedMap<xercesc_4_0::XSObject> *)0x0;
      this_01 = (RefHashTableOf<xercesc_4_0::XSObject,_xercesc_4_0::StringHasher> *)0x0;
    }
    this->fHashMap[uVar2] = this_01;
  }
  this_02 = (RefVectorOf<xercesc_4_0::XSAnnotation> *)XMemory::operator_new(0x30,manager);
  RefVectorOf<xercesc_4_0::XSAnnotation>::RefVectorOf(this_02,5,false,manager);
  this->fXSAnnotationList = this_02;
  return;
}

Assistant:

XSNamespaceItem::XSNamespaceItem(XSModel* const       xsModel,
                                 SchemaGrammar* const grammar,
                                 MemoryManager* const manager)
    : fMemoryManager(manager)
    , fGrammar(grammar)
    , fXSModel(xsModel)
    , fXSAnnotationList(0)
    , fSchemaNamespace(grammar->getTargetNamespace())
{
    // Populate XSNamedMaps by going through the components
    for (XMLSize_t i=0; i<XSConstants::MULTIVALUE_FACET; i++)
    {
        switch (i+1)
        {
            case XSConstants::ATTRIBUTE_DECLARATION:
            case XSConstants::ELEMENT_DECLARATION:
            case XSConstants::TYPE_DEFINITION:
            case XSConstants::ATTRIBUTE_GROUP_DEFINITION:
            case XSConstants::MODEL_GROUP_DEFINITION:
            case XSConstants::NOTATION_DECLARATION:
                fComponentMap[i] = new (fMemoryManager) XSNamedMap<XSObject>
                (
                    20,     // size
                    29,     // modulus
                    fXSModel->getURIStringPool(),
                    false,  // adoptElems
                    fMemoryManager
                );
                fHashMap[i] = new (fMemoryManager) RefHashTableOf<XSObject>
                (
                    29,
                    false,
                    fMemoryManager
                );
                break;
            default:
                // ATTRIBUTE_USE
                // MODEL_GROUP
                // PARTICLE
                // IDENTITY_CONSTRAINT
                // WILDCARD
                // ANNOTATION
                // FACET
                // MULTIVALUE
                fComponentMap[i] = 0;
                fHashMap[i] = 0;
                break;
        }
    }

    fXSAnnotationList = new (manager) RefVectorOf <XSAnnotation> (5, false, manager);
}